

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O2

bool __thiscall
antlr::CharScannerLiteralsLess::operator()(CharScannerLiteralsLess *this,string *x,string *y)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (*(this->scanner->super_TokenStream)._vptr_TokenStream[0x15])();
  if ((char)iVar2 != '\0') {
    bVar1 = std::operator<(x,y);
    return bVar1;
  }
  iVar2 = strcasecmp((x->_M_dataplus)._M_p,(y->_M_dataplus)._M_p);
  return SUB41((uint)iVar2 >> 0x1f,0);
}

Assistant:

inline bool CharScannerLiteralsLess::operator() (const ANTLR_USE_NAMESPACE(std)string& x,const ANTLR_USE_NAMESPACE(std)string& y) const
{
	if (scanner->getCaseSensitiveLiterals())
		return ANTLR_USE_NAMESPACE(std)less<ANTLR_USE_NAMESPACE(std)string>()(x,y);
	else
	{
#ifdef NO_STRCASECMP
		return (_stricmp(x.c_str(),y.c_str())<0);
#else
		return (strcasecmp(x.c_str(),y.c_str())<0);
#endif
	}